

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerMixin.cpp
# Opt level: O3

TimerId __thiscall
Liby::TimerMixin::runEvery(TimerMixin *this,Timestamp *timestamp,BasicHandler *handler)

{
  TimerId TVar1;
  _Head_base<0UL,_Liby::EventQueue_*,_false> local_28;
  
  if (runEvery(Liby::Timestamp_const&,std::function<void()>const&)::helper == '\0') {
    runEvery();
  }
  EventLoop::runEvery((EventLoop *)&stack0xffffffffffffffd0,(Timestamp *)this->loop_,
                      (BasicHandler *)timestamp);
  TVar1 = runHelper(this,(TimerHolder *)&stack0xffffffffffffffd0);
  if ((_Head_base<0UL,_Liby::EventQueue_*,_false>)local_28._M_head_impl !=
      (_Head_base<0UL,_Liby::EventQueue_*,_false>)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_28._M_head_impl);
  }
  return TVar1;
}

Assistant:

TimerId TimerMixin::runEvery(const Timestamp &timestamp,
                             const BasicHandler &handler) {
    static TimerMixinHelper helper(&loop_);
    return runHelper(loop_->runEvery(timestamp, handler));
}